

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day06a.cpp
# Opt level: O0

string * day6a::recover_message(string *__return_storage_ptr__,string *input)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  reference pcVar5;
  reference this;
  istream *piVar6;
  reference this_00;
  iterator pvVar7;
  iterator pvVar8;
  reference pvVar9;
  char *pcVar10;
  array<std::pair<char,_char>,_26UL> *letters;
  iterator __end1;
  iterator __begin1;
  vector<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
  *__range1;
  int i;
  value_type *l;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_200;
  char c;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  int i_1;
  vector<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
  columns;
  string local_1b8 [8];
  string line;
  istringstream stream;
  string *input_local;
  string *ret;
  
  std::__cxx11::istringstream::istringstream
            ((istringstream *)(line.field_2._M_local_buf + 8),(string *)input,_S_in);
  std::__cxx11::string::string(local_1b8);
  std::operator>>((istream *)(line.field_2._M_local_buf + 8),local_1b8);
  columns.
  super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  uVar3 = std::__cxx11::string::size();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,uVar3,' ',
             (allocator *)
             ((long)&columns.
                     super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&columns.
                     super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
  sVar4 = std::__cxx11::string::size();
  std::allocator<std::array<std::pair<char,_char>,_26UL>_>::allocator
            ((allocator<std::array<std::pair<char,_char>,_26UL>_> *)((long)&__range2 + 7));
  std::
  vector<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
  ::vector((vector<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
            *)&i_1,sVar4,
           (allocator<std::array<std::pair<char,_char>,_26UL>_> *)((long)&__range2 + 7));
  std::allocator<std::array<std::pair<char,_char>,_26UL>_>::~allocator
            ((allocator<std::array<std::pair<char,_char>,_26UL>_> *)((long)&__range2 + 7));
  do {
    __range2._0_4_ = 0;
    __end2._M_current = (char *)std::__cxx11::string::begin();
    _Stack_200._M_current = (char *)std::__cxx11::string::end();
    while( true ) {
      bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffe00);
      if (!bVar2) break;
      pcVar5 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
      cVar1 = *pcVar5;
      sVar4 = (size_type)(int)__range2;
      __range2._0_4_ = (int)__range2 + 1;
      this = std::
             vector<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
             ::operator[]((vector<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                           *)&i_1,sVar4);
      pvVar9 = std::array<std::pair<char,_char>,_26UL>::operator[](this,(long)(cVar1 + -0x61));
      pvVar9->first = cVar1;
      pvVar9->second = pvVar9->second + '\x01';
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    piVar6 = std::operator>>((istream *)(line.field_2._M_local_buf + 8),local_1b8);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
  } while (bVar2);
  __end1 = std::
           vector<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
           ::begin((vector<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                    *)&i_1);
  letters = (array<std::pair<char,_char>,_26UL> *)
            std::
            vector<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
            ::end((vector<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
                   *)&i_1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::array<std::pair<char,_char>,_26UL>_*,_std::vector<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>_>
                                *)&letters);
    if (!bVar2) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::array<std::pair<char,_char>,_26UL>_*,_std::vector<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>_>
              ::operator*(&__end1);
    pvVar7 = std::array<std::pair<char,_char>,_26UL>::begin(this_00);
    pvVar8 = std::array<std::pair<char,_char>,_26UL>::end(this_00);
    std::sort<std::pair<char,char>*,day6a::recover_message(std::__cxx11::string_const&)::__0>
              (pvVar7,pvVar8);
    pvVar9 = std::array<std::pair<char,_char>,_26UL>::operator[](this_00,0);
    cVar1 = pvVar9->first;
    pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *pcVar10 = cVar1;
    __gnu_cxx::
    __normal_iterator<std::array<std::pair<char,_char>,_26UL>_*,_std::vector<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>_>
    ::operator++(&__end1);
  }
  columns.
  super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
  std::
  vector<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
  ::~vector((vector<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
             *)&i_1);
  if ((columns.
       super__Vector_base<std::array<std::pair<char,_char>,_26UL>,_std::allocator<std::array<std::pair<char,_char>,_26UL>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::istringstream::~istringstream((istringstream *)(line.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string recover_message(const std::string& input) {
		std::istringstream stream(input);
		std::string line;
		stream >> line;
		std::string ret(line.size(), ' ');
		std::vector<std::array<std::pair<char, char>, 26>> columns(line.size());
		do {
			int i = 0;
			for(auto c : line) {
				auto& l = columns[i++][c - 'a'];
				l.first = c;
				l.second++;
			}
		} while(stream >> line);

		int i = 0;
		for(auto& letters : columns) {
			std::sort(letters.begin(), letters.end(), [](const auto& a, const auto& b) {
				return a.second > b.second;
			});
			ret[i++] = letters[0].first;
		}
		return ret;
	}